

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dsd_filters.cpp
# Opt level: O3

float __thiscall
DSDcc::DSDMBEAudioInterpolatorFilter::run(DSDMBEAudioInterpolatorFilter *this,float *sample)

{
  float fVar1;
  float fVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  
  if (this->m_useHP == true) {
    fVar5 = IIRFilter<float,_2U>::run(&this->m_filterHP,sample);
    uVar3 = *(undefined8 *)(this->m_filterLP).m_b;
    fVar6 = (this->m_filterLP).m_x[0];
    uVar4 = *(undefined8 *)((this->m_filterLP).m_x + 1);
    fVar1 = (this->m_filterLP).m_b[2];
    fVar2 = (this->m_filterLP).m_a[2];
    (this->m_filterLP).m_x[1] = fVar6;
    fVar7 = (float)((ulong)uVar4 >> 0x20);
    fVar6 = fVar7 * (this->m_filterLP).m_a[1] + fVar5 * (float)uVar3 +
            (float)uVar4 * fVar1 + fVar6 * (float)((ulong)uVar3 >> 0x20) +
            (this->m_filterLP).m_y[1] * fVar2;
    (this->m_filterLP).m_x[0] = fVar5;
    (this->m_filterLP).m_y[1] = fVar7;
    (this->m_filterLP).m_y[0] = fVar6;
    return fVar6;
  }
  fVar6 = IIRFilter<float,_2U>::run(&this->m_filterLP,sample);
  return fVar6;
}

Assistant:

float DSDMBEAudioInterpolatorFilter::run(const float& sample)
{
    return m_useHP ? m_filterLP.run(m_filterHP.run(sample)) : m_filterLP.run(sample);
}